

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  vector<char,std::allocator<char>> *pvVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  const_iterator cVar9;
  char *pcVar10;
  cmProcessOutput processOutput;
  int length;
  string *local_b8;
  vector<char,std::allocator<char>> *local_b0;
  string strdata;
  char *data;
  cmsysProcess *local_80;
  double timeout_local;
  string local_70;
  string local_50;
  
  local_b8 = line;
  local_80 = process;
  timeout_local = timeout;
  std::__cxx11::string::assign((char *)line);
  pcVar7 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_b0 = (vector<char,std::allocator<char>> *)err;
  cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
LAB_00311ee9:
  do {
    pvVar4 = local_b0;
    pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar6 = -(long)pcVar7;
    for (; pcVar10 = pcVar2, pcVar7 != pcVar2; pcVar7 = pcVar7 + 1) {
      cVar1 = *pcVar7;
      if (cVar1 == '\r') {
        pcVar10 = pcVar7;
        if (pcVar7 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar9._M_current =
             (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar9._M_current + lVar6)) || (pcVar7 != cVar9._M_current)) {
          std::__cxx11::string::append((char *)local_b8,(ulong)cVar9._M_current);
          cVar9._M_current =
               (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(out,cVar9,(const_iterator)(pcVar7 + 1));
        goto LAB_003120c6;
      }
      lVar6 = lVar6 + -1;
    }
    pcVar7 = pcVar10;
    pcVar2 = *(char **)(local_b0 + 8);
    lVar6 = -(long)pcVar8;
    for (pcVar10 = pcVar8; pcVar8 = pcVar2, pcVar10 != pcVar2; pcVar10 = pcVar10 + 1) {
      cVar1 = *pcVar10;
      if (cVar1 == '\r') {
        pcVar8 = pcVar10;
        if (pcVar10 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar9._M_current = *(char **)local_b0;
        if ((1 < (ulong)-(long)(cVar9._M_current + lVar6)) || (pcVar10 != cVar9._M_current)) {
          std::__cxx11::string::append((char *)local_b8,(ulong)cVar9._M_current);
          cVar9._M_current = *(char **)pvVar4;
        }
        std::vector<char,_std::allocator<char>_>::erase
                  ((vector<char,_std::allocator<char>_> *)pvVar4,cVar9,(const_iterator)(pcVar10 + 1)
                  );
        goto LAB_003120ed;
      }
      lVar6 = lVar6 + -1;
    }
    iVar5 = cmsysProcess_WaitForData(local_80,&data,&length,&timeout_local);
    if (iVar5 == 2) {
      cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,1);
      pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      cVar9._M_current =
           (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      std::vector<char,std::allocator<char>>::
      insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)out,cVar9,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )strdata._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(strdata._M_dataplus._M_p + strdata._M_string_length));
      pcVar7 = cVar9._M_current +
               ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start - (long)pcVar3);
      goto LAB_00311ee9;
    }
    if (iVar5 == 3) {
      cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,2);
      pvVar4 = local_b0;
      lVar6 = *(long *)local_b0;
      cVar9._M_current = *(char **)(local_b0 + 8);
      std::vector<char,std::allocator<char>>::
      insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (local_b0,cVar9,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )strdata._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(strdata._M_dataplus._M_p + strdata._M_string_length));
      pcVar8 = cVar9._M_current + (*(long *)pvVar4 - lVar6);
    }
    else {
      if (iVar5 == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
        std::__cxx11::string::~string((string *)&local_50);
        pvVar4 = local_b0;
        if (strdata._M_string_length != 0) {
          std::vector<char,std::allocator<char>>::
          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<char,std::allocator<char>> *)out,
                     (const_iterator)
                     (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )strdata._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(strdata._M_dataplus._M_p + strdata._M_string_length));
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
        std::__cxx11::string::~string((string *)&local_70);
        if (strdata._M_string_length != 0) {
          std::vector<char,std::allocator<char>>::
          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    (pvVar4,(const_iterator)*(char **)(pvVar4 + 8),
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )strdata._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(strdata._M_dataplus._M_p + strdata._M_string_length));
        }
        pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar3 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          if (*(ulong *)pvVar4 == *(ulong *)(pvVar4 + 8)) {
            iVar5 = 0;
          }
          else {
            std::__cxx11::string::append((char *)local_b8,*(ulong *)pvVar4);
            std::vector<char,_std::allocator<char>_>::erase
                      ((vector<char,_std::allocator<char>_> *)pvVar4,
                       (const_iterator)*(char **)pvVar4,(const_iterator)*(char **)(pvVar4 + 8));
LAB_003120ed:
            iVar5 = 3;
          }
        }
        else {
          std::__cxx11::string::append((char *)local_b8,(ulong)pcVar3);
          std::vector<char,_std::allocator<char>_>::erase
                    (out,(const_iterator)
                         (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                     (const_iterator)
                     (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
LAB_003120c6:
          iVar5 = 2;
        }
        goto LAB_003120f1;
      }
      if (iVar5 == 0xff) {
        iVar5 = 0xff;
LAB_003120f1:
        std::__cxx11::string::~string((string *)&strdata);
        cmProcessOutput::~cmProcessOutput(&processOutput);
        return iVar5;
      }
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&out[0], length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&err[0], length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), strdata.begin(), strdata.end());
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), strdata.begin(), strdata.end());
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        out.insert(out.end(), strdata.begin(), strdata.end());
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        err.insert(err.end(), strdata.begin(), strdata.end());
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(&out[0], outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(&err[0], erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}